

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ostream *poVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  Binasc binasc;
  stringstream binarydata;
  Binasc local_1b4;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  this->m_rwstatus = true;
  iVar2 = std::istream::peek();
  if (iVar2 == 0x4d) {
    bVar1 = readSmf(this,(istream *)CONCAT44(in_register_00000034,__fd));
    uVar4 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    this->m_rwstatus = bVar1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    Binasc::Binasc(&local_1b4);
    Binasc::writeToBinary(&local_1b4,local_190,(istream *)CONCAT44(in_register_00000034,__fd));
    std::istream::seekg((long)local_1a0,_S_beg);
    iVar2 = std::istream::peek();
    if (iVar2 == 0x4d) {
      bVar1 = readSmf(this,(istream *)local_1a0);
      uVar4 = CONCAT71(extraout_var_00,bVar1) & 0xffffffff;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Bad MIDI data input");
      bVar1 = false;
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar4 = 0;
    }
    this->m_rwstatus = bVar1;
    Binasc::~Binasc(&local_1b4);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return uVar4;
}

Assistant:

bool MidiFile::read(std::istream& input) {
	m_rwstatus = true;
	if (input.peek() != 'M') {
		// If the first byte in the input stream is not 'M', then presume that
		// the MIDI file is in the binasc format which is an ASCII representation
		// of the MIDI file.  Convert the binasc content into binary content and
		// then continue reading with this function.
		std::stringstream binarydata;
		Binasc binasc;
		binasc.writeToBinary(binarydata, input);
		binarydata.seekg(0, std::ios_base::beg);
		if (binarydata.peek() != 'M') {
			std::cerr << "Bad MIDI data input" << std::endl;
			m_rwstatus = false;
			return m_rwstatus;
		} else {
			m_rwstatus = readSmf(binarydata);
			return m_rwstatus;
		}
	} else {
		m_rwstatus = readSmf(input);
		return m_rwstatus;
	}
}